

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseArray<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  char *pcVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar6;
  
  is->src_ = is->src_ + 1;
  bVar3 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::StartArray(handler);
  if (bVar3) {
    SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(this,is);
    if (*(int *)(this + 0x30) == 0) {
      if (*is->src_ == ']') {
        is->src_ = is->src_ + 1;
        pcVar1 = (handler->stack_).stackTop_;
        pcVar1[-8] = '\0';
        pcVar1[-7] = '\0';
        pcVar1[-6] = '\0';
        pcVar1[-5] = '\0';
        pcVar1[-4] = '\0';
        pcVar1[-3] = '\0';
        pcVar1[-2] = '\x04';
        pcVar1[-1] = '\0';
        pcVar1[-0x10] = '\0';
        pcVar1[-0xf] = '\0';
        pcVar1[-0xe] = '\0';
        pcVar1[-0xd] = '\0';
        pcVar1[-0xc] = '\0';
        pcVar1[-0xb] = '\0';
        pcVar1[-10] = '\0';
        pcVar1[-9] = '\0';
      }
      else {
        uVar5 = 0;
        do {
          ParseValue<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                    (this,is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          if (*is->src_ != ',') {
            if (*is->src_ == ']') {
              uVar5 = uVar5 + 1;
              is->src_ = is->src_ + 1;
              pMVar2 = handler->allocator_;
              pcVar1 = (handler->stack_).stackTop_;
              pGVar6 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)(pcVar1 + (ulong)uVar5 * -0x10);
              (handler->stack_).stackTop_ = (char *)pGVar6;
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::SetArrayRaw((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)(pcVar1 + (ulong)uVar5 * -0x10 + -0x10),pGVar6,uVar5,pMVar2);
              return;
            }
            lVar4 = (long)is->src_ - (long)is->head_;
            *(undefined4 *)(this + 0x30) = 7;
            goto LAB_0013b2f8;
          }
          is->src_ = is->src_ + 1;
          SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                    (this,is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          uVar5 = uVar5 + 1;
        } while (*is->src_ != ']');
        pMVar2 = handler->allocator_;
        pcVar1 = (handler->stack_).stackTop_;
        pGVar6 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)(pcVar1 + (ulong)uVar5 * -0x10);
        (handler->stack_).stackTop_ = (char *)pGVar6;
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::SetArrayRaw((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)(pcVar1 + (ulong)uVar5 * -0x10 + -0x10),pGVar6,uVar5,pMVar2);
        is->src_ = is->src_ + 1;
      }
    }
  }
  else {
    lVar4 = (long)is->src_ - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 0x10;
LAB_0013b2f8:
    *(long *)(this + 0x38) = lVar4;
  }
  return;
}

Assistant:

void ParseArray(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == '[');
        is.Take();  // Skip '['

        if (RAPIDJSON_UNLIKELY(!handler.StartArray()))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

        if (Consume(is, ']')) {
            if (RAPIDJSON_UNLIKELY(!handler.EndArray(0))) // empty array
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
            return;
        }

        for (SizeType elementCount = 0;;) {
            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ++elementCount;
            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            if (Consume(is, ',')) {
                SkipWhitespaceAndComments<parseFlags>(is);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            }
            else if (Consume(is, ']')) {
                if (RAPIDJSON_UNLIKELY(!handler.EndArray(elementCount)))
                    RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                return;
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorArrayMissCommaOrSquareBracket, is.Tell());

            if (parseFlags & kParseTrailingCommasFlag) {
                if (is.Peek() == ']') {
                    if (RAPIDJSON_UNLIKELY(!handler.EndArray(elementCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    is.Take();
                    return;
                }
            }
        }
    }